

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

Vector * __thiscall fasttext::Vector::operator=(Vector *this,Vector *other)

{
  Vector *in_RDI;
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  
  std::vector<float,_std::allocator<float>_>::operator=(unaff_retaddr,&in_RDI->data_);
  return in_RDI;
}

Assistant:

Vector& Vector::operator=(Vector&& other) {
  data_ = std::move(other.data_);
  return *this;
}